

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O0

PList * p_list_prepend(PList *list,ppointer data)

{
  PList *item;
  ppointer data_local;
  PList *list_local;
  
  list_local = (PList *)p_malloc0(0x10);
  if (list_local == (PList *)0x0) {
    printf("** Error: %s **\n","PList::p_list_prepend: failed to allocate memory");
    list_local = list;
  }
  else {
    list_local->data = data;
    if (list != (PList *)0x0) {
      list_local->next = list;
    }
  }
  return list_local;
}

Assistant:

P_LIB_API PList *
p_list_prepend (PList		*list,
		ppointer	data)
{
	PList *item;

	if (P_UNLIKELY ((item = p_malloc0 (sizeof (PList))) == NULL)) {
		P_ERROR ("PList::p_list_prepend: failed to allocate memory");
		return list;
	}

	item->data = data;

	/* List is empty */
	if (P_UNLIKELY (list == NULL))
		return item;

	item->next = list;

	return item;
}